

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall higan::Channel::~Channel(Channel *this)

{
  std::_Function_base::~_Function_base(&(this->readable_callback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->writable_callback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->error_callback_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->connection_name_);
  return;
}

Assistant:

Channel::~Channel()
{

}